

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

Joint * __thiscall
CS248::DynamicScene::Skeleton::createNewJoint(Skeleton *this,Joint *parent,Vector3D *endPos)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Joint *this_00;
  Joint *newJoint;
  Matrix4x4 invT;
  Matrix4x4 T;
  Joint *local_1c0;
  Joint *local_1b8;
  double local_1b0;
  double dStack_1a8;
  double local_1a0;
  Vector4D local_198;
  Vector4D local_178;
  double local_148;
  double local_140;
  double local_138;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  this_00 = (Joint *)operator_new(0x160);
  Joint::Joint(this_00,this);
  this_00->parent = parent;
  local_198.x = endPos->x;
  local_198.y = endPos->y;
  local_198.z = endPos->z;
  local_198.w = 1.0;
  local_1c0 = this_00;
  (*(this_00->super_SceneObject)._vptr_SceneObject[0xb])(&local_b0,this_00);
  local_1b8 = parent;
  Matrix4x4::inv(&local_130,&local_b0);
  Matrix4x4::operator*(&local_130,&local_198);
  Vector4D::projectTo3D(&local_178);
  endPos->z = local_1a0;
  endPos->x = local_1b0;
  endPos->y = dStack_1a8;
  (this_00->axis).z = endPos->z;
  uVar2 = *(undefined4 *)((long)&endPos->x + 4);
  uVar3 = *(undefined4 *)&endPos->y;
  uVar4 = *(undefined4 *)((long)&endPos->y + 4);
  *(undefined4 *)&(this_00->axis).x = *(undefined4 *)&endPos->x;
  *(undefined4 *)((long)&(this_00->axis).x + 4) = uVar2;
  *(undefined4 *)&(this_00->axis).y = uVar3;
  *(undefined4 *)((long)&(this_00->axis).y + 4) = uVar4;
  (*(this->mesh->super_SceneObject)._vptr_SceneObject[4])(&local_178);
  dVar1 = SQRT(local_138 * local_138 + local_148 * local_148 + local_140 * local_140);
  this_00->renderScale = dVar1;
  this_00->capsuleRadius = dVar1 * this_00->capsuleRadius;
  if (local_1b8 != (Joint *)0x0) {
    std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::
    push_back(&local_1b8->kids,&local_1c0);
  }
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::
  push_back(&this->joints,&local_1c0);
  return local_1c0;
}

Assistant:

Joint* Skeleton::createNewJoint(Joint* parent, Vector3D endPos) {
  Joint* newJoint = new Joint(this);
  newJoint->parent = parent;
  // Get the endPos in joint's local coordinate frame
  Vector4D endPos4d(endPos, 1.);
  Matrix4x4 T = newJoint->getTransformation();
  Matrix4x4 invT = T.inv();
  endPos = (invT * endPos4d).projectTo3D();

  newJoint->axis = endPos;
  double meshScale = mesh->get_bbox().extent.norm();
  newJoint->renderScale = meshScale;
  newJoint->capsuleRadius *= meshScale;
  if (parent != nullptr) parent->kids.push_back(newJoint);
  joints.push_back(newJoint);

  return newJoint;
}